

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::loopback(TestMembraneImpl *this,LoopbackContext context)

{
  undefined1 local_b0 [24];
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  local_98;
  Maybe<capnp::MessageSize> local_90;
  Builder local_78;
  Reader local_50;
  
  local_90.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::getResults(&local_78,&local_98,&local_90);
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::getParams(&local_50,&local_98);
  capnproto_test::capnp::test::TestMembrane::LoopbackParams::Reader::getThing
            ((Client *)local_b0,&local_50);
  capnproto_test::capnp::test::TestMembrane::LoopbackResults::Builder::setThing
            (&local_78,(Client *)local_b0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_b0 + 8));
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> loopback(LoopbackContext context) override {
    context.getResults().setThing(context.getParams().getThing());
    return kj::READY_NOW;
  }